

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_2e03bb::Db::parseFoldExpr(Db *this)

{
  byte *pbVar1;
  byte *pbVar2;
  short *psVar3;
  Node *pNVar4;
  Node *pNVar5;
  byte *pbVar6;
  char *pcVar7;
  byte bVar8;
  char *pcVar9;
  byte bVar10;
  Node *pNVar11;
  
  pbVar6 = (byte *)this->First;
  pbVar2 = (byte *)this->Last;
  if (pbVar6 == pbVar2) {
    return (Node *)0x0;
  }
  if (*pbVar6 != 0x66) {
    return (Node *)0x0;
  }
  pbVar1 = pbVar6 + 1;
  this->First = (char *)pbVar1;
  if (pbVar2 == pbVar1) {
    bVar10 = 0;
  }
  else {
    bVar10 = *pbVar1;
  }
  bVar8 = 1;
  if (bVar10 < 0x6c) {
    if (bVar10 == 0x4c) goto LAB_00191867;
    if (bVar10 != 0x52) {
      return (Node *)0x0;
    }
  }
  else {
    if (bVar10 == 0x6c) goto LAB_00191867;
    if (bVar10 != 0x72) {
      return (Node *)0x0;
    }
  }
  bVar8 = 0;
LAB_00191867:
  pbVar1 = pbVar6 + 2;
  this->First = (char *)pbVar1;
  if (((ulong)((long)pbVar2 - (long)pbVar1) < 2) || (*(short *)pbVar1 != 0x6161)) {
    psVar3 = (short *)this->First;
    if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x6e61)) {
      psVar3 = (short *)this->First;
      if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x4e61)) {
        psVar3 = (short *)this->First;
        if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x5361)) {
          psVar3 = (short *)this->First;
          if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x6d63)) {
            psVar3 = (short *)this->First;
            if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x7364)) {
              psVar3 = (short *)this->First;
              if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x7664)) {
                psVar3 = (short *)this->First;
                if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x5664)) {
                  psVar3 = (short *)this->First;
                  if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x6f65)) {
                    psVar3 = (short *)this->First;
                    if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x4f65)) {
                      psVar3 = (short *)this->First;
                      if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x7165)) {
                        psVar3 = (short *)this->First;
                        if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x6567)) {
                          psVar3 = (short *)this->First;
                          if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x7467)) {
                            psVar3 = (short *)this->First;
                            if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x656c)) {
                              psVar3 = (short *)this->First;
                              if (((ulong)((long)pbVar2 - (long)psVar3) < 2) || (*psVar3 != 0x736c))
                              {
                                psVar3 = (short *)this->First;
                                if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                   (*psVar3 != 0x536c)) {
                                  psVar3 = (short *)this->First;
                                  if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                     (*psVar3 != 0x746c)) {
                                    psVar3 = (short *)this->First;
                                    if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                       (*psVar3 != 0x696d)) {
                                      psVar3 = (short *)this->First;
                                      if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                         (*psVar3 != 0x496d)) {
                                        psVar3 = (short *)this->First;
                                        if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                           (*psVar3 != 0x6c6d)) {
                                          psVar3 = (short *)this->First;
                                          if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                             (*psVar3 != 0x4c6d)) {
                                            psVar3 = (short *)this->First;
                                            if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                               (*psVar3 != 0x656e)) {
                                              psVar3 = (short *)this->First;
                                              if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                                 (*psVar3 != 0x6f6f)) {
                                                psVar3 = (short *)this->First;
                                                if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                                   (*psVar3 != 0x726f)) {
                                                  psVar3 = (short *)this->First;
                                                  if (((ulong)((long)pbVar2 - (long)psVar3) < 2) ||
                                                     (*psVar3 != 0x526f)) {
                                                    psVar3 = (short *)this->First;
                                                    if (((ulong)((long)pbVar2 - (long)psVar3) < 2)
                                                       || (*psVar3 != 0x6c70)) {
                                                      psVar3 = (short *)this->First;
                                                      if (((ulong)((long)pbVar2 - (long)psVar3) < 2)
                                                         || (*psVar3 != 0x4c70)) {
                                                        psVar3 = (short *)this->First;
                                                        if (((ulong)((long)pbVar2 - (long)psVar3) <
                                                             2) || (*psVar3 != 0x6d72)) {
                                                          psVar3 = (short *)this->First;
                                                          if (((ulong)((long)pbVar2 - (long)psVar3)
                                                               < 2) || (*psVar3 != 0x4d72)) {
                                                            psVar3 = (short *)this->First;
                                                            if (((ulong)((long)pbVar2 - (long)psVar3
                                                                        ) < 2) ||
                                                               (*psVar3 != 0x7372)) {
                                                              psVar3 = (short *)this->First;
                                                              if ((ulong)((long)pbVar2 -
                                                                         (long)psVar3) < 2) {
                                                                return (Node *)0x0;
                                                              }
                                                              if (*psVar3 != 0x5372) {
                                                                return (Node *)0x0;
                                                              }
                                                              pbVar6 = (byte *)(psVar3 + 1);
                                                              pcVar9 = ">>=";
                                                              pcVar7 = "";
                                                            }
                                                            else {
                                                              pbVar6 = (byte *)(psVar3 + 1);
                                                              pcVar9 = ">>";
                                                              pcVar7 = "";
                                                            }
                                                          }
                                                          else {
                                                            pbVar6 = (byte *)(psVar3 + 1);
                                                            pcVar9 = "%=";
                                                            pcVar7 = "";
                                                          }
                                                        }
                                                        else {
                                                          pbVar6 = (byte *)(psVar3 + 1);
                                                          pcVar9 = "%";
                                                          pcVar7 = "";
                                                        }
                                                      }
                                                      else {
                                                        pbVar6 = (byte *)(psVar3 + 1);
                                                        pcVar9 = "+=";
                                                        pcVar7 = "";
                                                      }
                                                    }
                                                    else {
                                                      pbVar6 = (byte *)(psVar3 + 1);
                                                      pcVar9 = "+";
                                                      pcVar7 = "";
                                                    }
                                                  }
                                                  else {
                                                    pbVar6 = (byte *)(psVar3 + 1);
                                                    pcVar9 = "|=";
                                                    pcVar7 = "";
                                                  }
                                                }
                                                else {
                                                  pbVar6 = (byte *)(psVar3 + 1);
                                                  pcVar9 = "|";
                                                  pcVar7 = "";
                                                }
                                              }
                                              else {
                                                pbVar6 = (byte *)(psVar3 + 1);
                                                pcVar9 = "||";
                                                pcVar7 = "";
                                              }
                                            }
                                            else {
                                              pbVar6 = (byte *)(psVar3 + 1);
                                              pcVar9 = "!=";
                                              pcVar7 = "";
                                            }
                                          }
                                          else {
                                            pbVar6 = (byte *)(psVar3 + 1);
                                            pcVar9 = "*=";
                                            pcVar7 = "";
                                          }
                                        }
                                        else {
                                          pbVar6 = (byte *)(psVar3 + 1);
                                          pcVar9 = "*";
                                          pcVar7 = "";
                                        }
                                      }
                                      else {
                                        pbVar6 = (byte *)(psVar3 + 1);
                                        pcVar9 = "-=";
                                        pcVar7 = "";
                                      }
                                    }
                                    else {
                                      pbVar6 = (byte *)(psVar3 + 1);
                                      pcVar9 = "-";
                                      pcVar7 = "";
                                    }
                                  }
                                  else {
                                    pbVar6 = (byte *)(psVar3 + 1);
                                    pcVar9 = "<";
                                    pcVar7 = "";
                                  }
                                }
                                else {
                                  pbVar6 = (byte *)(psVar3 + 1);
                                  pcVar9 = "<<=";
                                  pcVar7 = "";
                                }
                              }
                              else {
                                pbVar6 = (byte *)(psVar3 + 1);
                                pcVar9 = "<<";
                                pcVar7 = "";
                              }
                            }
                            else {
                              pbVar6 = (byte *)(psVar3 + 1);
                              pcVar9 = "<=";
                              pcVar7 = "";
                            }
                          }
                          else {
                            pbVar6 = (byte *)(psVar3 + 1);
                            pcVar9 = ">";
                            pcVar7 = "";
                          }
                        }
                        else {
                          pbVar6 = (byte *)(psVar3 + 1);
                          pcVar9 = ">=";
                          pcVar7 = "";
                        }
                      }
                      else {
                        pbVar6 = (byte *)(psVar3 + 1);
                        pcVar9 = "==";
                        pcVar7 = "";
                      }
                    }
                    else {
                      pbVar6 = (byte *)(psVar3 + 1);
                      pcVar9 = "^=";
                      pcVar7 = "";
                    }
                  }
                  else {
                    pbVar6 = (byte *)(psVar3 + 1);
                    pcVar9 = "^";
                    pcVar7 = "";
                  }
                }
                else {
                  pbVar6 = (byte *)(psVar3 + 1);
                  pcVar9 = "/=";
                  pcVar7 = "";
                }
              }
              else {
                pbVar6 = (byte *)(psVar3 + 1);
                pcVar9 = "/";
                pcVar7 = "";
              }
            }
            else {
              pbVar6 = (byte *)(psVar3 + 1);
              pcVar9 = ".*";
              pcVar7 = "";
            }
          }
          else {
            pbVar6 = (byte *)(psVar3 + 1);
            pcVar9 = ",";
            pcVar7 = "";
          }
        }
        else {
          pbVar6 = (byte *)(psVar3 + 1);
          pcVar9 = "=";
          pcVar7 = "";
        }
      }
      else {
        pbVar6 = (byte *)(psVar3 + 1);
        pcVar9 = "&=";
        pcVar7 = "";
      }
    }
    else {
      pbVar6 = (byte *)(psVar3 + 1);
      pcVar9 = "&";
      pcVar7 = "";
    }
  }
  else {
    pbVar6 = pbVar6 + 4;
    pcVar9 = "&&";
    pcVar7 = "";
  }
  this->First = (char *)pbVar6;
  pNVar4 = parseExpr(this);
  if (pNVar4 == (Node *)0x0) {
    return (Node *)0x0;
  }
  if ((bVar10 == 0x52) || (bVar10 == 0x4c)) {
    pNVar5 = parseExpr(this);
    if (pNVar5 == (Node *)0x0) {
      return (Node *)0x0;
    }
  }
  else {
    pNVar5 = (Node *)0x0;
  }
  pNVar11 = pNVar5;
  if ((pNVar5 != (Node *)0x0 & bVar8) != 0) {
    pNVar11 = pNVar4;
    pNVar4 = pNVar5;
  }
  pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x38);
  pNVar5->K = KExpr;
  pNVar5->RHSComponentCache = No;
  pNVar5->ArrayCache = No;
  pNVar5->FunctionCache = No;
  pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d4a68;
  pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
  *(Node **)&pNVar5[1].K = pNVar11;
  pNVar5[2]._vptr_Node = (_func_int **)pcVar9;
  *(char **)&pNVar5[2].K = pcVar7;
  *(byte *)&pNVar5[3]._vptr_Node = bVar8;
  return pNVar5;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }